

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

OffsetData * QTimeZonePrivate::toOffsetData(Data *data)

{
  long lVar1;
  qint64 qVar2;
  long in_RSI;
  OffsetData *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  Initialization in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  QTimeZone *timeZone;
  OffsetData *msecs;
  QTimeZone local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 0x18);
  msecs = in_RDI;
  qVar2 = invalidMSecs();
  if (lVar1 == qVar2) {
    invalidOffsetData();
  }
  else {
    QString::QString(in_stack_ffffffffffffff90,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    timeZone = &local_10;
    QTimeZone::QTimeZone((QTimeZone *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    QDateTime::fromMSecsSinceEpoch((qint64)msecs,timeZone);
    msecs->offsetFromUtc = *(int *)(in_RSI + 0x20);
    msecs->standardTimeOffset = *(int *)(in_RSI + 0x24);
    msecs->daylightTimeOffset = *(int *)(in_RSI + 0x28);
    QTimeZone::~QTimeZone((QTimeZone *)0x73ad83);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZone::OffsetData QTimeZonePrivate::toOffsetData(const QTimeZonePrivate::Data &data)
{
    if (data.atMSecsSinceEpoch == invalidMSecs())
        return invalidOffsetData();

    return {
        data.abbreviation,
        QDateTime::fromMSecsSinceEpoch(data.atMSecsSinceEpoch, QTimeZone::UTC),
        data.offsetFromUtc, data.standardTimeOffset, data.daylightTimeOffset };
}